

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O0

uint64_t Assimp::FBX::anon_unknown_3::ReadDoubleWord(char *input,char **cursor,char *end)

{
  uint64_t uVar1;
  size_t sVar2;
  uint64_t dword;
  allocator local_49;
  string local_48;
  undefined8 local_28;
  size_t k_to_read;
  char *end_local;
  char **cursor_local;
  char *input_local;
  
  local_28 = 8;
  k_to_read = (size_t)end;
  end_local = (char *)cursor;
  cursor_local = (char **)input;
  sVar2 = Offset(*cursor,end);
  if (sVar2 < 8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"cannot ReadDoubleWord, out of bounds",&local_49);
    TokenizeError(&local_48,(char *)cursor_local,*(char **)end_local);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  uVar1 = **(uint64_t **)end_local;
  *(long *)end_local = *(long *)end_local + 8;
  return uVar1;
}

Assistant:

uint64_t ReadDoubleWord(const char* input, const char*& cursor, const char* end) {
    const size_t k_to_read = sizeof(uint64_t);
    if(Offset(cursor, end) < k_to_read) {
        TokenizeError("cannot ReadDoubleWord, out of bounds",input, cursor);
    }

    uint64_t dword /*= *reinterpret_cast<const uint64_t*>(cursor)*/;
    ::memcpy( &dword, cursor, sizeof( uint64_t ) );
    AI_SWAP8(dword);

    cursor += k_to_read;

    return dword;
}